

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

int allphone_search_finish(ps_search_t *search)

{
  int iVar1;
  long lVar2;
  double dVar3;
  int local_5c;
  int local_50;
  int local_44;
  double n_speech;
  int32 n_hist;
  int32 cf;
  allphone_search_t *allphs;
  ps_search_t *search_local;
  
  *(int *)&search[1].hyp_str = *(int *)&search[1].d2p + *(int *)&search[1].hyp_str;
  iVar1 = *(int *)&(search[1].last_link)->best_prev;
  if (*(int *)&search[1].d2p < 1) {
    local_44 = 0;
  }
  else {
    local_44 = *(int *)((long)&search[1].hyp_str + 4) / *(int *)&search[1].d2p;
  }
  if (*(int *)&search[1].d2p < 1) {
    local_50 = 0;
  }
  else {
    local_50 = *(int *)&search[1].dag / *(int *)&search[1].d2p;
  }
  if (*(int *)&search[1].d2p < 1) {
    local_5c = 0;
  }
  else {
    local_5c = iVar1 / *(int *)&search[1].d2p;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x357,"%d frames, %d HMMs (%d/fr), %d senones (%d/fr), %d history entries (%d/fr)\n",
          (ulong)*(uint *)&search[1].d2p,(ulong)*(uint *)((long)&search[1].hyp_str + 4),local_44,
          *(undefined4 *)&search[1].dag,local_50,iVar1,local_5c);
  allphone_backtrace((allphone_search_t *)search,*(int *)&search[1].d2p + -1,(int32 *)0x0);
  ptmr_stop((ptmr_t *)&search[1].start_wid);
  iVar1 = search->acmod->output_frame;
  if (0 < iVar1) {
    lVar2 = ps_config_int(search->config,"frate");
    dVar3 = (double)(iVar1 + 1) / (double)lVar2;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x364,"allphone %.2f CPU %.3f xRT\n",*(undefined8 *)&search[1].finish_wid,
            *(double *)&search[1].finish_wid / dVar3);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x366,"allphone %.2f wall %.3f xRT\n",search[2].vt,(double)search[2].vt / dVar3);
  }
  return 0;
}

Assistant:

int
allphone_search_finish(ps_search_t * search)
{
    allphone_search_t *allphs;
    int32 cf, n_hist;

    allphs = (allphone_search_t *) search;

    allphs->n_tot_frame += allphs->frame;
    n_hist = blkarray_list_n_valid(allphs->history);
    E_INFO
        ("%d frames, %d HMMs (%d/fr), %d senones (%d/fr), %d history entries (%d/fr)\n",
         allphs->frame, allphs->n_hmm_eval,
         (allphs->frame > 0) ? allphs->n_hmm_eval / allphs->frame : 0,
         allphs->n_sen_eval,
         (allphs->frame > 0) ? allphs->n_sen_eval / allphs->frame : 0,
         n_hist, (allphs->frame > 0) ? n_hist / allphs->frame : 0);

    /* Now backtrace. */
    allphone_backtrace(allphs, allphs->frame - 1, NULL);

    /* Print out some statistics. */
    ptmr_stop(&allphs->perf);
    /* This is the number of frames processed. */
    cf = ps_search_acmod(allphs)->output_frame;
    if (cf > 0) {
        double n_speech = (double) (cf + 1)
            / ps_config_int(ps_search_config(allphs), "frate");
        E_INFO("allphone %.2f CPU %.3f xRT\n",
               allphs->perf.t_cpu, allphs->perf.t_cpu / n_speech);
        E_INFO("allphone %.2f wall %.3f xRT\n",
               allphs->perf.t_elapsed, allphs->perf.t_elapsed / n_speech);
    }


    return 0;
}